

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O2

void TestDoubleToExponential(void)

{
  bool bVar1;
  undefined1 in_CL;
  undefined1 uVar2;
  char *in_R8;
  char *in_R9;
  StringBuilder local_1f0;
  DoubleToStringConverter local_1d8;
  DoubleToStringConverter local_1a8;
  DoubleToStringConverter local_178;
  DoubleToStringConverter local_148;
  char buffer [256];
  char *pcVar3;
  
  local_1f0.buffer_.start_ = buffer;
  local_1f0.buffer_.length_ = 0x100;
  local_1d8.flags_ = 9;
  local_1d8.infinity_symbol_ = "Infinity";
  local_1d8.nan_symbol_ = "NaN";
  local_1d8.exponent_character_ = 'e';
  local_1d8.min_exponent_width_ = 0;
  local_1d8.decimal_in_shortest_low_ = 0;
  local_1d8.decimal_in_shortest_high_ = 0;
  local_1d8.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_1d8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1d8,0.0,5,&local_1f0);
  CheckHelper((char *)0x2cf,0xc0f964,(char *)(ulong)bVar1,(bool)in_CL);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x2d0,0xc0f987,"0.00000e+0",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1d8,0.0,0,&local_1f0);
  CheckHelper((char *)0x2d3,0xc0f99f,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x2d4,0xc0f9c2,"0e+0",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1d8,0.0,1,&local_1f0);
  CheckHelper((char *)0x2d7,0xc0f9c9,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x2d8,0xc0f9ec,"0.0e+0",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                    (&local_1d8,0.123456,5,&local_1f0);
  CheckHelper((char *)0x2db,0xc0f9fc,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x2dc,0xc0fa24,"1.23456e-1",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1d8,1.2,1,&local_1f0);
  CheckHelper((char *)0x2df,0xc0fa3c,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x2e0,0xc0fa5f,"1.2e+0",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1d8,-0.0,1,&local_1f0);
  CheckHelper((char *)0x2e3,0xc0fa6f,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x2e4,0xc0f9ec,"0.0e+0",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1d8,0.0,2,&local_1f0);
  CheckHelper((char *)0x2e7,0xc0fa93,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x2e8,0xc0fab6,"0.00e+0",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1d8,-0.0,2,&local_1f0);
  CheckHelper((char *)0x2eb,0xc0fac8,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x2ec,0xc0fab6,"0.00e+0",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1d8,0.0,0x78,&local_1f0);
  CheckHelper((char *)0x2f1,0xc0faec,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x2f4,0xc0fb3d,
                    "0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000e+0"
                    ,local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                    (&local_1d8,9e+59,0x78,&local_1f0);
  CheckHelper((char *)0x2f8,0xc0fc3e,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x2fb,0xc0fc90,
                    "8.999999999999999187672294497176199538101312736746906562068480000000000000000000000000000000000000000000000000000000000000e+59"
                    ,local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                    (&local_1d8,-9e+59,0x78,&local_1f0);
  CheckHelper((char *)0x2ff,0xc0fd14,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x302,0xc0fd67,
                    "-8.999999999999999187672294497176199538101312736746906562068480000000000000000000000000000000000000000000000000000000000000e+59"
                    ,local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                    (&local_1d8,1.79769313486232e+308,0x78,&local_1f0);
  CheckHelper((char *)0x307,0xc0fe6c,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x30a,0xc0fec4,
                    "1.797693134862315708145274237317043567980705675258449965989174768031572607800285387605895586327668781715404589535143824642e+308"
                    ,local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1d8,1e-06,2,&local_1f0);
  CheckHelper((char *)0x30d,0xc0ffc9,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x30e,0xc0fff1,"1.00e-6",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1d8,1e-07,2,&local_1f0);
  CheckHelper((char *)0x311,0xc10003,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x312,0xc1002c,"1.00e-7",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1a8.flags_ = 0;
  local_1a8.infinity_symbol_ = "Infinity";
  local_1a8.nan_symbol_ = "NaN";
  local_1a8.exponent_character_ = 'e';
  local_1a8.min_exponent_width_ = 0;
  local_1a8.decimal_in_shortest_low_ = 0;
  local_1a8.decimal_in_shortest_high_ = 0;
  local_1a8.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_1a8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1a8,3.12,1,&local_1f0);
  CheckHelper((char *)0x319,0xc1003e,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x31a,0xc10063,"3.1e0",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1a8,5.0,3,&local_1f0);
  CheckHelper((char *)0x31d,0xc10071,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x31e,0xc10095,"5.000e0",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1a8,0.001,2,&local_1f0);
  CheckHelper((char *)0x321,0xc100a7,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x322,0xc100cd,"1.00e-3",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1a8,3.1415,-1,&local_1f0)
  ;
  CheckHelper((char *)0x325,0xc100df,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x326,0xc10107,"3.1415e0",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1a8,3.1415,4,&local_1f0);
  CheckHelper((char *)0x329,0xc1011b,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x32a,0xc10107,"3.1415e0",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1a8,3.1415,3,&local_1f0);
  CheckHelper((char *)0x32d,0xc10142,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x32e,0xc10169,"3.142e0",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                    (&local_1a8,123456789000000.0,3,&local_1f0);
  CheckHelper((char *)0x331,0xc1017b,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x332,0xc101ab,"1.235e14",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1a8,1e+30,-1,&local_1f0);
  CheckHelper((char *)0x335,0xc101bf,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x336,0xc10202,"1e30",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                    (&local_1a8,1e+30,0x20,&local_1f0);
  CheckHelper((char *)0x339,0xc1020e,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x33a,0xc10251,"1.00000000000000001988462483865600e30",
                    local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_1a8,1234.0,0,&local_1f0);
  CheckHelper((char *)0x33d,0xc1029f,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x33e,0xc102c4,"1e3",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_148.flags_ = 0;
  local_148.infinity_symbol_ = (char *)0x0;
  local_148.nan_symbol_ = (char *)0x0;
  local_148.exponent_character_ = 'e';
  local_148.min_exponent_width_ = 0;
  local_148.decimal_in_shortest_low_ = 0;
  local_148.decimal_in_shortest_high_ = 0;
  local_148.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_148.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                    (&local_148,INFINITY,1,&local_1f0);
  CheckHelper((char *)0x344,0xc102ce,(char *)(ulong)!bVar1,(bool)uVar2);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                    (&local_148,-INFINITY,1,&local_1f0);
  CheckHelper((char *)0x347,0xc10302,(char *)(ulong)!bVar1,(bool)uVar2);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_148,NAN,1,&local_1f0);
  CheckHelper((char *)0x34a,0xc10337,(char *)(ulong)!bVar1,(bool)uVar2);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_148,-NAN,1,&local_1f0);
  CheckHelper((char *)0x34d,0xc10366,(char *)(ulong)!bVar1,(bool)uVar2);
  local_178.flags_ = 0;
  local_178.infinity_symbol_ = "Infinity";
  local_178.nan_symbol_ = "NaN";
  local_178.exponent_character_ = 'e';
  local_178.decimal_in_shortest_low_ = 0;
  local_178.decimal_in_shortest_high_ = 0;
  local_178.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_178.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_178.min_exponent_width_ = 0;
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                    (&local_178,INFINITY,1,&local_1f0);
  CheckHelper((char *)0x352,0xc10396,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x353,0xc0e6b4,"Infinity",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential
                    (&local_178,-INFINITY,1,&local_1f0);
  CheckHelper((char *)0x356,0xc103c9,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x357,0xc0e6ed,"-Infinity",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_178,NAN,1,&local_1f0);
  CheckHelper((char *)0x35a,0xc103fd,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  pcVar3 = local_1f0.buffer_.start_;
  CheckEqualsHelper((char *)0x35b,0xc0e72b,"NaN",local_1f0.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1f0.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToExponential(&local_178,-NAN,1,&local_1f0);
  CheckHelper((char *)0x35e,0xc1042b,(char *)(ulong)bVar1,(bool)uVar2);
  local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  local_1f0.position_ = -1;
  CheckEqualsHelper((char *)0x35f,0xc0e72b,"NaN",local_1f0.buffer_.start_,in_R8,in_R9);
  if (-1 < (long)local_1f0.position_) {
    local_1f0.buffer_.start_[local_1f0.position_] = '\0';
  }
  return;
}

Assistant:

TEST(DoubleToExponential) {
  const int kBufferSize = 256;
  char buffer[kBufferSize];
  int flags = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN |
      DoubleToStringConverter::UNIQUE_ZERO;
  StringBuilder builder(buffer, kBufferSize);
  DoubleToStringConverter dc(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc.ToExponential(0.0, 5, &builder));
  CHECK_EQ("0.00000e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.0, 0, &builder));
  CHECK_EQ("0e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.0, 1, &builder));
  CHECK_EQ("0.0e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.123456, 5, &builder));
  CHECK_EQ("1.23456e-1", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(1.2, 1, &builder));
  CHECK_EQ("1.2e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(-0.0, 1, &builder));
  CHECK_EQ("0.0e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.0, 2, &builder));
  CHECK_EQ("0.00e+0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(-0.0, 2, &builder));
  CHECK_EQ("0.00e+0", builder.Finalize());

  DOUBLE_CONVERSION_ASSERT(DoubleToStringConverter::kMaxExponentialDigits == 120);
  builder.Reset();
  CHECK(dc.ToExponential(
      0.0, DoubleToStringConverter::kMaxExponentialDigits, &builder));
  CHECK_EQ("0.00000000000000000000000000000000000000000000000000000000000"
           "0000000000000000000000000000000000000000000000000000000000000e+0",
           builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(
      9e59, DoubleToStringConverter::kMaxExponentialDigits, &builder));
  CHECK_EQ("8.99999999999999918767229449717619953810131273674690656206848"
           "0000000000000000000000000000000000000000000000000000000000000e+59",
           builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(
      -9e59, DoubleToStringConverter::kMaxExponentialDigits, &builder));
  CHECK_EQ("-8.99999999999999918767229449717619953810131273674690656206848"
           "0000000000000000000000000000000000000000000000000000000000000e+59",
           builder.Finalize());

  const double max_double = 1.7976931348623157e308;
  builder.Reset();
  CHECK(dc.ToExponential(
      max_double, DoubleToStringConverter::kMaxExponentialDigits, &builder));
  CHECK_EQ("1.79769313486231570814527423731704356798070567525844996598917"
           "4768031572607800285387605895586327668781715404589535143824642e+308",
           builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.000001, 2, &builder));
  CHECK_EQ("1.00e-6", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToExponential(0.0000001, 2, &builder));
  CHECK_EQ("1.00e-7", builder.Finalize());

  // Test the examples in the comments of ToExponential.
  flags = DoubleToStringConverter::NO_FLAGS;
  DoubleToStringConverter dc2(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc2.ToExponential(3.12, 1, &builder));
  CHECK_EQ("3.1e0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(5.0, 3, &builder));
  CHECK_EQ("5.000e0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(0.001, 2, &builder));
  CHECK_EQ("1.00e-3", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(3.1415, -1, &builder));
  CHECK_EQ("3.1415e0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(3.1415, 4, &builder));
  CHECK_EQ("3.1415e0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(3.1415, 3, &builder));
  CHECK_EQ("3.142e0", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(123456789000000, 3, &builder));
  CHECK_EQ("1.235e14", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(1000000000000000019884624838656.0, -1, &builder));
  CHECK_EQ("1e30", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(1000000000000000019884624838656.0, 32, &builder));
  CHECK_EQ("1.00000000000000001988462483865600e30", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToExponential(1234, 0, &builder));
  CHECK_EQ("1e3", builder.Finalize());

  // Test special value handling.
  DoubleToStringConverter dc3(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(!dc3.ToExponential(Double::Infinity(), 1, &builder));

  builder.Reset();
  CHECK(!dc3.ToExponential(-Double::Infinity(), 1, &builder));

  builder.Reset();
  CHECK(!dc3.ToExponential(Double::NaN(), 1, &builder));

  builder.Reset();
  CHECK(!dc3.ToExponential(-Double::NaN(), 1, &builder));

  DoubleToStringConverter dc4(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc4.ToExponential(Double::Infinity(), 1, &builder));
  CHECK_EQ("Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToExponential(-Double::Infinity(), 1, &builder));
  CHECK_EQ("-Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToExponential(Double::NaN(), 1, &builder));
  CHECK_EQ("NaN", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToExponential(-Double::NaN(), 1, &builder));
  CHECK_EQ("NaN", builder.Finalize());
}